

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_pars.cpp
# Opt level: O2

UBool __thiscall icu_63::RuleHalf::isValidOutput(RuleHalf *this,TransliteratorParser *transParser)

{
  short sVar1;
  int32_t iVar2;
  UBool UVar3;
  uint ch;
  int32_t iVar4;
  int32_t offset;
  
  iVar2 = 0;
  do {
    offset = iVar2;
    sVar1 = (this->text).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->text).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if (iVar4 <= offset) break;
    ch = icu_63::UnicodeString::char32At(&this->text,offset);
    UVar3 = ParseData::isReplacer(transParser->parseData,ch);
    iVar2 = (offset - (uint)(ch < 0x10000)) + 2;
  } while (UVar3 != '\0');
  return iVar4 <= offset;
}

Assistant:

UBool RuleHalf::isValidOutput(TransliteratorParser& transParser) {
    for (int32_t i=0; i<text.length(); ) {
        UChar32 c = text.char32At(i);
        i += U16_LENGTH(c);
        if (!transParser.parseData->isReplacer(c)) {
            return FALSE;
        }
    }
    return TRUE;
}